

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# received_packet.h
# Opt level: O0

void __thiscall
ReceivedPacket::ReceivedPacket
          (ReceivedPacket *this,uint16_t sequence_number,uint8_t *data,uint16_t data_len)

{
  pointer puVar1;
  uint16_t data_len_local;
  uint8_t *data_local;
  uint16_t sequence_number_local;
  ReceivedPacket *this_local;
  
  this->sequence_number = 0;
  this->data_len = 0;
  std::unique_ptr<unsigned_char,std::default_delete<unsigned_char>>::
  unique_ptr<std::default_delete<unsigned_char>,void>
            ((unique_ptr<unsigned_char,std::default_delete<unsigned_char>> *)&this->data);
  this->data_len = data_len;
  puVar1 = (pointer)operator_new__((ulong)data_len);
  std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::reset(&this->data,puVar1);
  puVar1 = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get(&this->data);
  memcpy(puVar1,data,(ulong)data_len);
  this->sequence_number = sequence_number;
  return;
}

Assistant:

explicit ReceivedPacket(uint16_t sequence_number, const uint8_t* data, uint16_t data_len) {
		this->data_len = data_len;
		this->data.reset(new uint8_t[data_len]);
		memcpy(this->data.get(), data, data_len);
		this->sequence_number = sequence_number;
	}